

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeSequentialContainer<QList<QVariant>>(QDataStream *s,QList<QVariant> *c)

{
  bool bVar1;
  value_type *t;
  QVariant *p;
  long lVar2;
  
  bVar1 = QDataStream::writeQSizeType(s,(c->d).size);
  if (bVar1) {
    p = (c->d).ptr;
    for (lVar2 = (c->d).size << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
      ::operator<<(s,p);
      p = p + 1;
    }
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}